

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

void __thiscall Jupiter::SecureTCPSocket::~SecureTCPSocket(SecureTCPSocket *this)

{
  SecureTCPSocket *this_local;
  
  ~SecureTCPSocket(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

class JUPITER_API SecureTCPSocket : public SecureSocket
	{
	public:
		SecureTCPSocket &operator=(SecureTCPSocket &&source);
		SecureTCPSocket();
		SecureTCPSocket(const SecureTCPSocket &) = delete;
		SecureTCPSocket(size_t bufferSize);
		SecureTCPSocket(Jupiter::Socket &&source);
		SecureTCPSocket(Jupiter::SecureSocket &&source);
	}